

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tree_state_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                      nk_collapse_states *state)

{
  float fVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_vec2 nVar4;
  nk_rect b;
  nk_rect bounds;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_color nVar5;
  int iVar6;
  nk_command_buffer *b_00;
  nk_style *pnVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect nVar11;
  float local_11c;
  float local_104;
  nk_context *local_100;
  nk_context *local_f8;
  nk_rect label;
  nk_style_item *background;
  nk_widget_layout_states widget_state;
  nk_flags ws;
  nk_text text;
  nk_rect sym;
  nk_rect header;
  nk_vec2 item_spacing;
  float row_height;
  nk_symbol_type symbol;
  nk_style_button *button;
  nk_input *in;
  nk_command_buffer *out;
  nk_style *style;
  nk_panel *layout;
  nk_window *win;
  nk_collapse_states *state_local;
  char *title_local;
  nk_image *img_local;
  nk_tree_type type_local;
  nk_context *ctx_local;
  
  memset(&sym.w,0,0x10);
  memset(&text.background,0,0x10);
  background._4_4_ = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x47c2,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        pnVar2 = ctx->current;
        pnVar3 = pnVar2->layout;
        b_00 = &pnVar2->buffer;
        pnVar7 = &ctx->style;
        nVar4 = (ctx->style).window.spacing;
        fVar8 = (ctx->style).tab.padding.y;
        fVar8 = fVar8 + fVar8 + pnVar7->font->height;
        nk_layout_set_min_row_height(ctx,fVar8);
        nk_layout_row_dynamic(ctx,fVar8,1);
        nk_layout_reset_min_row_height(ctx);
        background._0_4_ = nk_widget((nk_rect *)&sym.w,ctx);
        if (type == NK_TREE_TAB) {
          if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
            r_00.y = sym.h;
            r_00.x = sym.w;
            r_00.w = header.x;
            r_00.h = header.y;
            nk_draw_image(b_00,r_00,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
            text.padding.x = (float)nk_rgba(0,0,0,0);
          }
          else {
            text.padding.x = *(float *)&(ctx->style).tab.background.data.color;
            nVar11.y = sym.h;
            nVar11.x = sym.w;
            nVar11.w = header.x;
            nVar11.h = header.y;
            nk_fill_rect(b_00,nVar11,0.0,(ctx->style).tab.border_color);
            r_01.y = sym.h;
            r_01.x = sym.w;
            r_01.w = header.x;
            r_01.h = header.y;
            nVar11 = nk_shrink_rect(r_01,(ctx->style).tab.border);
            nk_fill_rect(b_00,nVar11,(ctx->style).tab.rounding,
                         (ctx->style).tab.background.data.color);
          }
        }
        else {
          text.padding.x = *(float *)&(ctx->style).window.background;
        }
        local_f8 = ctx;
        if ((pnVar3->flags & 0x1000) != 0) {
          local_f8 = (nk_context *)0x0;
        }
        if ((local_f8 == (nk_context *)0x0) ||
           (local_100 = ctx, (nk_widget_layout_states)background != NK_WIDGET_VALID)) {
          local_100 = (nk_context *)0x0;
        }
        r_02.y = sym.h;
        r_02.x = sym.w;
        r_02.w = header.x;
        r_02.h = header.y;
        iVar6 = nk_button_behavior((nk_flags *)((long)&background + 4),r_02,&local_100->input,
                                   NK_BUTTON_DEFAULT);
        if (iVar6 != 0) {
          *state = (uint)(*state != NK_MAXIMIZED);
        }
        if (*state == NK_MAXIMIZED) {
          item_spacing.y = (float)(ctx->style).tab.sym_maximize;
          if (type == NK_TREE_TAB) {
            _row_height = &(ctx->style).tab.tab_maximize_button;
          }
          else {
            _row_height = &(ctx->style).tab.node_maximize_button;
          }
        }
        else {
          item_spacing.y = (float)(ctx->style).tab.sym_minimize;
          if (type == NK_TREE_TAB) {
            _row_height = &(ctx->style).tab.tab_minimize_button;
          }
          else {
            _row_height = &(ctx->style).tab.node_minimize_button;
          }
        }
        sym.x = pnVar7->font->height;
        text.text = (nk_color)(sym.h + (ctx->style).tab.padding.y);
        text.background = (nk_color)(sym.w + (ctx->style).tab.padding.x);
        bounds.y = (float)text.text;
        bounds.x = (float)text.background;
        bounds.w = sym.x;
        bounds.h = sym.x;
        sym.y = sym.x;
        nk_do_button_symbol((nk_flags *)((long)&background + 4),&pnVar2->buffer,bounds,
                            (nk_symbol_type)item_spacing.y,NK_BUTTON_DEFAULT,_row_height,
                            (nk_input *)0x0,pnVar7->font);
        header.w = nVar4.x;
        if (img != (nk_image *)0x0) {
          text.background = (nk_color)(header.w * 4.0 + (float)text.background + sym.x);
          r.y = (float)text.text;
          r.x = (float)text.background;
          r.w = sym.x;
          r.h = sym.y;
          nk_draw_image(&pnVar2->buffer,r,img,(nk_color)0xffffffff);
          sym.x = pnVar7->font->height + (ctx->style).tab.spacing.x;
        }
        nVar5 = text.text;
        if (sym.x + header.w <= header.x) {
          local_104 = header.x;
        }
        else {
          local_104 = sym.x + header.w;
        }
        fVar9 = (float)text.background + sym.x;
        header.h = nVar4.y;
        fVar10 = sym.x + header.h;
        fVar8 = (ctx->style).tab.indent;
        fVar1 = pnVar7->font->height;
        text.padding.y = *(float *)&(ctx->style).tab.text;
        _widget_state = nk_vec2(0.0,0.0);
        iVar6 = nk_strlen(title);
        b.y = (float)nVar5;
        b.x = fVar9 + header.w;
        b.w = local_104 - (fVar10 + fVar8);
        b.h = fVar1;
        nk_widget_text(b_00,b,title,iVar6,(nk_text *)&widget_state,0x11,pnVar7->font);
        if (*state == NK_MAXIMIZED) {
          pnVar3->at_x = sym.w + (float)*pnVar3->offset_x + (ctx->style).tab.indent;
          if ((ctx->style).tab.indent <= (pnVar3->bounds).w) {
            local_11c = (pnVar3->bounds).w;
          }
          else {
            local_11c = (ctx->style).tab.indent;
          }
          (pnVar3->bounds).w = local_11c;
          (pnVar3->bounds).w =
               (pnVar3->bounds).w - ((ctx->style).tab.indent + (ctx->style).window.padding.x);
          (pnVar3->row).tree_depth = (pnVar3->row).tree_depth + 1;
          ctx_local._4_4_ = 1;
        }
        else {
          ctx_local._4_4_ = 0;
        }
      }
      return ctx_local._4_4_;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x47c4,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x47c3,
                "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
               );
}

Assistant:

NK_INTERN int
nk_tree_state_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states *state)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;
    const struct nk_input *in;
    const struct nk_style_button *button;
    enum nk_symbol_type symbol;
    float row_height;

    struct nk_vec2 item_spacing;
    struct nk_rect header = {0,0,0,0};
    struct nk_rect sym = {0,0,0,0};
    struct nk_text text;

    nk_flags ws = 0;
    enum nk_widget_layout_states widget_state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* cache some data */
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    style = &ctx->style;
    item_spacing = style->window.spacing;

    /* calculate header bounds and draw background */
    row_height = style->font->height + 2 * style->tab.padding.y;
    nk_layout_set_min_row_height(ctx, row_height);
    nk_layout_row_dynamic(ctx, row_height, 1);
    nk_layout_reset_min_row_height(ctx);

    widget_state = nk_widget(&header, ctx);
    if (type == NK_TREE_TAB) {
        const struct nk_style_item *background = &style->tab.background;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            nk_draw_image(out, header, &background->data.image, nk_white);
            text.background = nk_rgba(0,0,0,0);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, style->tab.border_color);
            nk_fill_rect(out, nk_shrink_rect(header, style->tab.border),
                style->tab.rounding, background->data.color);
        }
    } else text.background = style->window.background;

    /* update node state */
    in = (!(layout->flags & NK_WINDOW_ROM)) ? &ctx->input: 0;
    in = (in && widget_state == NK_WIDGET_VALID) ? &ctx->input : 0;
    if (nk_button_behavior(&ws, header, in, NK_BUTTON_DEFAULT))
        *state = (*state == NK_MAXIMIZED) ? NK_MINIMIZED : NK_MAXIMIZED;

    /* select correct button style */
    if (*state == NK_MAXIMIZED) {
        symbol = style->tab.sym_maximize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_maximize_button;
        else button = &style->tab.node_maximize_button;
    } else {
        symbol = style->tab.sym_minimize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_minimize_button;
        else button = &style->tab.node_minimize_button;
    }

    {/* draw triangle button */
    sym.w = sym.h = style->font->height;
    sym.y = header.y + style->tab.padding.y;
    sym.x = header.x + style->tab.padding.x;
    nk_do_button_symbol(&ws, &win->buffer, sym, symbol, NK_BUTTON_DEFAULT,
        button, 0, style->font);

    if (img) {
        /* draw optional image icon */
        sym.x = sym.x + sym.w + 4 * item_spacing.x;
        nk_draw_image(&win->buffer, sym, img, nk_white);
        sym.w = style->font->height + style->tab.spacing.x;}
    }

    {/* draw label */
    struct nk_rect label;
    header.w = NK_MAX(header.w, sym.w + item_spacing.x);
    label.x = sym.x + sym.w + item_spacing.x;
    label.y = sym.y;
    label.w = header.w - (sym.w + item_spacing.y + style->tab.indent);
    label.h = style->font->height;
    text.text = style->tab.text;
    text.padding = nk_vec2(0,0);
    nk_widget_text(out, label, title, nk_strlen(title), &text,
        NK_TEXT_LEFT, style->font);}

    /* increase x-axis cursor widget position pointer */
    if (*state == NK_MAXIMIZED) {
        layout->at_x = header.x + (float)*layout->offset_x + style->tab.indent;
        layout->bounds.w = NK_MAX(layout->bounds.w, style->tab.indent);
        layout->bounds.w -= (style->tab.indent + style->window.padding.x);
        layout->row.tree_depth++;
        return nk_true;
    } else return nk_false;
}